

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O0

HelicsFilter
helicsFederateRegisterFilter(HelicsFederate fed,HelicsFilterTypes type,char *name,HelicsError *err)

{
  string_view name_00;
  bool bVar1;
  element_type *this;
  Filter *pFVar2;
  pointer pFVar3;
  Federate *in_RDX;
  FilterTypes in_ESI;
  size_t in_RDI;
  __single_object filt;
  shared_ptr<helics::Federate> fedObj;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  FilterTypes type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  shared_ptr<helics::Federate> *this_00;
  HelicsError *in_stack_ffffffffffffff30;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *this_01;
  HelicsFederate in_stack_ffffffffffffff38;
  allocator<char> *__a;
  undefined4 in_stack_ffffffffffffff58;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> local_98;
  byte local_8a;
  allocator<char> local_89;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
  *in_stack_ffffffffffffff78;
  HelicsFederate in_stack_ffffffffffffff80;
  shared_ptr<helics::Federate> local_48;
  __shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2> local_38;
  char *in_stack_fffffffffffffff8;
  HelicsFilter pvVar4;
  
  getFedSharedPtr(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_38);
  if (bVar1) {
    std::make_unique<helics::FilterObject>();
    type_00 = in_ESI;
    this = std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::get(&local_38);
    local_8a = 0;
    if (in_RDX == (Federate *)0x0) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_ESI,in_stack_ffffffffffffff58));
    }
    else {
      __a = &local_89;
      std::allocator<char>::allocator();
      local_8a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)CONCAT44(in_ESI,in_stack_ffffffffffffff58),__a);
    }
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff20);
    name_00._M_str = in_stack_fffffffffffffff8;
    name_00._M_len = in_RDI;
    pFVar2 = helics::make_filter(type_00,in_RDX,name_00);
    pFVar3 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
             operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)0x1e5429);
    pFVar3->filtPtr = pFVar2;
    std::__cxx11::string::~string(in_stack_ffffffffffffff20);
    if ((local_8a & 1) != 0) {
      std::allocator<char>::~allocator(&local_89);
    }
    this_00 = &local_48;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::operator->
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               0x1e5461);
    std::shared_ptr<helics::Federate>::operator=
              (this_00,(shared_ptr<helics::Federate> *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    pFVar3 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
             operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)0x1e548a);
    pFVar3->custom = type_00 == CUSTOM;
    this_01 = &local_98;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::unique_ptr
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               this_00,(unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                        *)CONCAT44(type_00,in_stack_ffffffffffffff18));
    pvVar4 = anon_unknown.dwarf_88686::federateAddFilter
                       (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (this_01);
    local_48.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (this_01);
  }
  else {
    pvVar4 = (HelicsFilter)0x0;
    local_48.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
  }
  std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1e55f5);
  return pvVar4;
}

Assistant:

HelicsFilter helicsFederateRegisterFilter(HelicsFederate fed, HelicsFilterTypes type, const char* name, HelicsError* err)
{
    // now generate a generic subscription
    auto fedObj = getFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }

    try {
        auto filt = std::make_unique<helics::FilterObject>();
        filt->filtPtr = &helics::make_filter(static_cast<helics::FilterTypes>(type), fedObj.get(), AS_STRING(name));
        filt->fedptr = std::move(fedObj);
        filt->custom = (type == HELICS_FILTER_TYPE_CUSTOM);
        return federateAddFilter(fed, std::move(filt));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}